

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O2

int ps_alignment_populate_ci(ps_alignment_t *al)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  bin_mdef_t *pbVar4;
  dict_t *pdVar5;
  int32 iVar6;
  ps_alignment_entry_t *ppVar7;
  uint16 uVar8;
  char *fmt;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ps_alignment_entry_t *ppVar13;
  
  (al->sseq).n_ent = 0;
  (al->state).n_ent = 0;
  pbVar4 = al->d2p->mdef;
  pdVar5 = al->d2p->dict;
  uVar10 = 0;
  do {
    if ((al->word).n_ent <= uVar10) {
      uVar10 = 0;
      do {
        if ((al->sseq).n_ent <= uVar10) {
          return 0;
        }
        ppVar13 = (al->sseq).seq + uVar10;
        for (lVar9 = 0; lVar9 < pbVar4->n_emit_state; lVar9 = lVar9 + 1) {
          ppVar7 = ps_alignment_vector_grow_one(&al->state);
          if (ppVar7 == (ps_alignment_entry_t *)0x0) {
            fmt = "Failed to add state entry!\n";
            lVar9 = 0x129;
            goto LAB_0010e6b6;
          }
          uVar8 = pbVar4->sseq[(ppVar13->id).pid.ssid][lVar9];
          (ppVar7->id).pid.cipid = uVar8;
          if (uVar8 == 0xffff) {
            __assert_fail("sent->id.senid != BAD_SENID",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                          ,0x12d,"int ps_alignment_populate_ci(ps_alignment_t *)");
          }
          iVar6 = ppVar13->duration;
          ppVar7->start = ppVar13->start;
          ppVar7->duration = iVar6;
          ppVar7->score = 0;
          ppVar7->parent = (int)uVar10;
          if (lVar9 == 0) {
            ppVar13->child = (uint)(((long)ppVar7 - (long)(al->state).seq) / 0x1c) & 0xffff;
          }
        }
        uVar10 = uVar10 + 1;
      } while( true );
    }
    ppVar7 = (al->word).seq;
    ppVar13 = ppVar7 + uVar10;
    iVar2 = ppVar7[uVar10].id.wid;
    uVar3 = pdVar5->word[iVar2].pronlen;
    uVar12 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar12 = 0;
    }
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      ppVar7 = ps_alignment_vector_grow_one(&al->sseq);
      if (ppVar7 == (ps_alignment_entry_t *)0x0) {
        fmt = "Failed to add phone entry!\n";
        lVar9 = 0x111;
LAB_0010e6b6:
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                ,lVar9,fmt);
        return -1;
      }
      sVar1 = pdVar5->word[iVar2].ciphone[uVar11];
      (ppVar7->id).pid.cipid = sVar1;
      (ppVar7->id).pid.tmatid = pbVar4->phone[sVar1].tmat;
      uVar8 = (uint16)pbVar4->phone[sVar1].ssid;
      (ppVar7->id).pid.ssid = uVar8;
      if (uVar8 == 0xffff) {
        __assert_fail("sent->id.pid.ssid != BAD_SSID",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                      ,0x117,"int ps_alignment_populate_ci(ps_alignment_t *)");
      }
      iVar6 = ppVar13->duration;
      ppVar7->start = ppVar13->start;
      ppVar7->duration = iVar6;
      ppVar7->score = 0;
      ppVar7->parent = (int)uVar10;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

int
ps_alignment_populate_ci(ps_alignment_t *al)
{
    dict2pid_t *d2p;
    dict_t *dict;
    bin_mdef_t *mdef;
    int i;

    /* Clear phone and state sequences. */
    ps_alignment_vector_empty(&al->sseq);
    ps_alignment_vector_empty(&al->state);

    /* For each word, expand to phones/senone sequences. */
    d2p = al->d2p;
    dict = d2p->dict;
    mdef = d2p->mdef;
    for (i = 0; i < al->word.n_ent; ++i) {
        ps_alignment_entry_t *went = al->word.seq + i;
        ps_alignment_entry_t *sent;
        int wid = went->id.wid;
        int len = dict_pronlen(dict, wid);
        int j;

        for (j = 0; j < len; ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
                E_ERROR("Failed to add phone entry!\n");
                return -1;
            }
            sent->id.pid.cipid = dict_pron(dict, wid, j);
            sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
            sent->id.pid.ssid = bin_mdef_pid2ssid(mdef, sent->id.pid.cipid);
            assert(sent->id.pid.ssid != BAD_SSID);
            sent->start = went->start;
            sent->duration = went->duration;
            sent->score = 0;
            sent->parent = i;
        }
    }

    /* For each senone sequence, expand to senones.  (we could do this
     * nested above but this makes it more clear and easier to
     * refactor) */
    for (i = 0; i < al->sseq.n_ent; ++i) {
        ps_alignment_entry_t *pent = al->sseq.seq + i;
        ps_alignment_entry_t *sent;
        int j;

        for (j = 0; j < bin_mdef_n_emit_state(mdef); ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->state)) == NULL) {
                E_ERROR("Failed to add state entry!\n");
                return -1;
            }
            sent->id.senid = bin_mdef_sseq2sen(mdef, pent->id.pid.ssid, j);
            assert(sent->id.senid != BAD_SENID);
            sent->start = pent->start;
            sent->duration = pent->duration;
            sent->score = 0;
            sent->parent = i;
            if (j == 0)
                pent->child = (uint16)(sent - al->state.seq);
        }
    }

    return 0;
}